

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.h
# Opt level: O2

BBox3fa * __thiscall
embree::sse2::BVHNRefitT<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::leafBounds
          (BBox3fa *__return_storage_ptr__,
          BVHNRefitT<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *this,NodeRef *ref)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  ulong uVar6;
  TriangleMesh *pTVar7;
  long lVar8;
  char *pcVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  float *pfVar13;
  long lVar14;
  long lVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  vuint<4> vprimID;
  vuint<4> vgeomID;
  float local_e8 [30];
  Vec3vf<4> v2;
  Vec3vf<4> v1;
  
  uVar6 = ref->ptr;
  if (uVar6 == 8) {
    *(undefined8 *)&(__return_storage_ptr__->lower).field_0 = 0x7f8000007f800000;
    *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = 0x7f8000007f800000;
    *(undefined8 *)&(__return_storage_ptr__->upper).field_0 = 0xff800000ff800000;
    *(undefined8 *)((long)&(__return_storage_ptr__->upper).field_0 + 8) = 0xff800000ff800000;
  }
  else {
    lVar11 = (uVar6 & 0xfffffffffffffff0) + 0xa0;
    aVar16 = _DAT_01f45a40;
    aVar17 = _DAT_01f45a30;
    for (lVar12 = 0; lVar12 != (ulong)((uint)uVar6 & 0xf) - 8; lVar12 = lVar12 + 1) {
      pfVar13 = (float *)(lVar12 * 0xb0 + (uVar6 & 0xfffffffffffffff0));
      pTVar7 = this->mesh;
      v2.field_0._40_4_ = 0xffffffff;
      v2.field_0._44_4_ = 0xffffffff;
      v2.field_0._24_4_ = 0xffffffff;
      v2.field_0._28_4_ = 0xffffffff;
      v2.field_0._32_4_ = 0xffffffff;
      v2.field_0._36_4_ = 0xffffffff;
      v2.field_0._8_8_ = 0;
      v2.field_0._16_8_ = 0;
      local_e8[0x1c] = 0.0;
      local_e8[0x1d] = 0.0;
      v2.field_0._0_8_ = 0;
      local_e8[0x18] = 0.0;
      local_e8[0x19] = 0.0;
      local_e8[0x1a] = 0.0;
      local_e8[0x1b] = 0.0;
      local_e8[0x14] = 0.0;
      local_e8[0x15] = 0.0;
      local_e8[0x16] = 0.0;
      local_e8[0x17] = 0.0;
      local_e8[0x10] = 0.0;
      local_e8[0x11] = 0.0;
      local_e8[0x12] = 0.0;
      local_e8[0x13] = 0.0;
      local_e8[0xc] = 0.0;
      local_e8[0xd] = 0.0;
      local_e8[0xe] = 0.0;
      local_e8[0xf] = 0.0;
      local_e8[8] = 0.0;
      local_e8[9] = 0.0;
      local_e8[10] = 0.0;
      local_e8[0xb] = 0.0;
      local_e8[4] = 0.0;
      local_e8[5] = 0.0;
      local_e8[6] = 0.0;
      local_e8[7] = 0.0;
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      local_e8[3] = 0.0;
      aVar18 = _DAT_01f45a40;
      aVar19 = _DAT_01f45a30;
      for (lVar14 = 0; (lVar14 != 0x10 && (iVar4 = *(int *)(lVar11 + -0x10 + lVar14), iVar4 != -1));
          lVar14 = lVar14 + 4) {
        uVar5 = *(uint *)(lVar11 + lVar14);
        lVar15 = (ulong)uVar5 * *(long *)&pTVar7->field_0x68;
        lVar8 = *(long *)&(pTVar7->super_Geometry).field_0x58;
        pcVar9 = (pTVar7->vertices0).super_RawBufferView.ptr_ofs;
        sVar10 = (pTVar7->vertices0).super_RawBufferView.stride;
        auVar1 = *(undefined1 (*) [16])(pcVar9 + *(uint *)(lVar8 + lVar15) * sVar10);
        auVar2 = *(undefined1 (*) [16])(pcVar9 + *(uint *)(lVar8 + 4 + lVar15) * sVar10);
        auVar3 = *(undefined1 (*) [16])(pcVar9 + *(uint *)(lVar8 + 8 + lVar15) * sVar10);
        auVar20 = minps(auVar2,auVar3);
        auVar21 = maxps(auVar2,auVar3);
        auVar22 = minps(auVar1,auVar20);
        auVar20 = maxps(auVar1,auVar21);
        aVar19.m128 = (__m128)minps(aVar19.m128,auVar22);
        aVar18.m128 = (__m128)maxps(aVar18.m128,auVar20);
        *(int *)((long)&v2.field_0 + lVar14 + 0x28) = iVar4;
        *(uint *)((long)&v2.field_0 + lVar14 + 0x18) = uVar5;
        *(int *)((long)local_e8 + lVar14 + 0x60) = auVar1._0_4_;
        *(int *)((long)local_e8 + lVar14 + 0x70) = auVar1._4_4_;
        *(int *)((long)&v2.field_0 + lVar14 + 8) = auVar1._8_4_;
        *(int *)((long)local_e8 + lVar14 + 0x30) = auVar2._0_4_;
        *(int *)((long)local_e8 + lVar14 + 0x40) = auVar2._4_4_;
        *(int *)((long)local_e8 + lVar14 + 0x50) = auVar2._8_4_;
        *(int *)((long)local_e8 + lVar14) = auVar3._0_4_;
        *(int *)((long)local_e8 + lVar14 + 0x10) = auVar3._4_4_;
        *(int *)((long)local_e8 + lVar14 + 0x20) = auVar3._8_4_;
      }
      *pfVar13 = local_e8[0x18];
      pfVar13[1] = local_e8[0x19];
      pfVar13[2] = local_e8[0x1a];
      pfVar13[3] = local_e8[0x1b];
      pfVar13[4] = local_e8[0x1c];
      pfVar13[5] = local_e8[0x1d];
      pfVar13[6] = (float)v2.field_0._0_4_;
      pfVar13[7] = (float)v2.field_0._4_4_;
      pfVar13[8] = (float)v2.field_0._8_4_;
      pfVar13[9] = (float)v2.field_0._12_4_;
      pfVar13[10] = (float)v2.field_0._16_4_;
      pfVar13[0xb] = (float)v2.field_0._20_4_;
      pfVar13[0xc] = local_e8[0x18] - local_e8[0xc];
      pfVar13[0xd] = local_e8[0x19] - local_e8[0xd];
      pfVar13[0xe] = local_e8[0x1a] - local_e8[0xe];
      pfVar13[0xf] = local_e8[0x1b] - local_e8[0xf];
      pfVar13[0x10] = local_e8[0x1c] - local_e8[0x10];
      pfVar13[0x11] = local_e8[0x1d] - local_e8[0x11];
      pfVar13[0x12] = (float)v2.field_0._0_4_ - local_e8[0x12];
      pfVar13[0x13] = (float)v2.field_0._4_4_ - local_e8[0x13];
      pfVar13[0x14] = (float)v2.field_0._8_4_ - local_e8[0x14];
      pfVar13[0x15] = (float)v2.field_0._12_4_ - local_e8[0x15];
      pfVar13[0x16] = (float)v2.field_0._16_4_ - local_e8[0x16];
      pfVar13[0x17] = (float)v2.field_0._20_4_ - local_e8[0x17];
      pfVar13[0x18] = local_e8[0] - local_e8[0x18];
      pfVar13[0x19] = local_e8[1] - local_e8[0x19];
      pfVar13[0x1a] = local_e8[2] - local_e8[0x1a];
      pfVar13[0x1b] = local_e8[3] - local_e8[0x1b];
      pfVar13[0x1c] = local_e8[4] - local_e8[0x1c];
      pfVar13[0x1d] = local_e8[5] - local_e8[0x1d];
      pfVar13[0x1e] = local_e8[6] - (float)v2.field_0._0_4_;
      pfVar13[0x1f] = local_e8[7] - (float)v2.field_0._4_4_;
      pfVar13[0x20] = local_e8[8] - (float)v2.field_0._8_4_;
      pfVar13[0x21] = local_e8[9] - (float)v2.field_0._12_4_;
      pfVar13[0x22] = local_e8[10] - (float)v2.field_0._16_4_;
      pfVar13[0x23] = local_e8[0xb] - (float)v2.field_0._20_4_;
      *(ulong *)(pfVar13 + 0x24) = CONCAT44(v2.field_0._44_4_,v2.field_0._40_4_);
      pfVar13[0x26] = -NAN;
      pfVar13[0x27] = -NAN;
      *(ulong *)(pfVar13 + 0x28) = CONCAT44(v2.field_0._28_4_,v2.field_0._24_4_);
      *(ulong *)(pfVar13 + 0x2a) = CONCAT44(v2.field_0._36_4_,v2.field_0._32_4_);
      aVar17.m128 = (__m128)minps(aVar17.m128,aVar19.m128);
      aVar16.m128 = (__m128)maxps(aVar16.m128,aVar18.m128);
      lVar11 = lVar11 + 0xb0;
    }
    (__return_storage_ptr__->lower).field_0 = aVar17;
    (__return_storage_ptr__->upper).field_0 = aVar16;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual const BBox3fa leafBounds (NodeRef& ref) const
      {
        size_t num; char* prim = ref.leaf(num);
        if (unlikely(ref == BVH::emptyNode)) return empty;

        BBox3fa bounds = empty;
        for (size_t i=0; i<num; i++)
            bounds.extend(((Primitive*)prim)[i].update(mesh));
        return bounds;
      }